

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<24U,_unsigned_char,_void,_false> * __thiscall
math::wide_integer::uintwide_t<12288U,_unsigned_int,_void,_false>::operator%=
          (uintwide_t<12288U,_unsigned_int,_void,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other)

{
  bool bVar1;
  bool bVar2;
  iterator first;
  iterator last;
  uintwide_t<24U,_unsigned_char,_void,_false> local_181c [2];
  uintwide_t<24U,_unsigned_char,_void,_false> remainder;
  uintwide_t<24U,_unsigned_char,_void,_false> local_121c [2];
  local_unsigned_wide_type remainder_unsigned;
  uintwide_t<24U,_unsigned_char,_void,_false> local_c1c [2];
  local_unsigned_wide_type b;
  uintwide_t<12288U,_unsigned_int,_void,_false> local_61c [8];
  local_unsigned_wide_type a;
  bool denom_was_neg;
  bool numer_was_neg;
  uintwide_t<24U,_unsigned_char,_void,_false> *other_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  if (this == (uintwide_t<12288U,_unsigned_int,_void,_false> *)other) {
    first = detail::array_detail::array<unsigned_int,_384UL>::begin
                      ((array<unsigned_int,_384UL> *)this);
    last = detail::array_detail::array<unsigned_int,_384UL>::end((array<unsigned_int,_384UL> *)this)
    ;
    detail::fill_unsafe<unsigned_int*,unsigned_int>(first,last,0);
  }
  else {
    bVar1 = is_neg<false>((uintwide_t<24U,_unsigned_char,_void,_false> *)this,
                          (enable_if_t<(_false),_int> *)0x0);
    bVar2 = is_neg<false>(other,(enable_if_t<(_false),_int> *)0x0);
    if ((bVar1) || (bVar2)) {
      memcpy(local_61c,this,0x600);
      memcpy(local_c1c,other,0x600);
      if (bVar1) {
        negate(local_61c);
      }
      if (bVar2) {
        negate((uintwide_t<12288U,_unsigned_int,_void,_false> *)local_c1c);
      }
      memset(local_121c,0,0x600);
      uintwide_t((uintwide_t<12288U,_unsigned_int,_void,_false> *)local_121c);
      eval_divide_knuth(local_61c,local_c1c,local_121c);
      if (bVar1) {
        negate((uintwide_t<12288U,_unsigned_int,_void,_false> *)local_121c);
      }
      memcpy(this,local_121c,0x600);
    }
    else {
      memset(local_181c,0,0x600);
      uintwide_t((uintwide_t<12288U,_unsigned_int,_void,_false> *)local_181c);
      eval_divide_knuth(this,other,local_181c);
      memcpy(this,local_181c,0x600);
    }
  }
  return (uintwide_t<24U,_unsigned_char,_void,_false> *)this;
}

Assistant:

constexpr auto operator%=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else
      {
        // Unary modulus function.
        const auto numer_was_neg = is_neg(*this);
        const auto denom_was_neg = is_neg(other);

        if(numer_was_neg || denom_was_neg)
        {
          using local_unsigned_wide_type = uintwide_t<Width2, limb_type, AllocatorType, false>;

          local_unsigned_wide_type a(*this);
          local_unsigned_wide_type b(other);

          if(numer_was_neg) { a.negate(); }
          if(denom_was_neg) { b.negate(); }

          local_unsigned_wide_type remainder_unsigned { };

          a.eval_divide_knuth(b, &remainder_unsigned);

          // The sign of the remainder follows the sign of the denominator.
          if(numer_was_neg) { remainder_unsigned.negate(); }

          values = remainder_unsigned.values;
        }
        else
        {
          uintwide_t remainder { };

          eval_divide_knuth(other, &remainder);

          values = remainder.values;
        }
      }

      return *this;
    }